

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator.cpp
# Opt level: O0

void cal_dataReady(stringstream *st)

{
  double dVar1;
  int _gS;
  int _atk;
  int _gpos;
  int _cpos;
  bool bVar2;
  void *pvVar3;
  istream *this;
  mapped_type *pmVar4;
  reference pvVar5;
  reference pvVar6;
  reference __x;
  int local_9c;
  int local_98;
  int i_2;
  int tmpNum;
  int tmpPlaneID;
  int i_1;
  int planeTypeNum;
  int *local_70;
  int *tmpGridSize;
  uint local_60;
  int j;
  int bit;
  int tmpCarrierGridNum;
  int tmpCarrierID;
  int local_44;
  int local_40;
  int i;
  int ifFighterOnly;
  int tmpAvailBit;
  string tmpName;
  int local_14;
  stringstream *psStack_10;
  int leastAttackerSz;
  stringstream *st_local;
  
  psStack_10 = st;
  pvVar3 = (void *)std::istream::operator>>(st,&tarAirSupremacy);
  pvVar3 = (void *)std::istream::operator>>(pvVar3,&op_coef);
  pvVar3 = (void *)std::istream::operator>>(pvVar3,&accu_coef);
  pvVar3 = (void *)std::istream::operator>>(pvVar3,&local_14);
  pvVar3 = (void *)std::istream::operator>>(pvVar3,&armor);
  std::istream::operator>>(pvVar3,&nearing_coef);
  armor_max = (int)((double)armor * 1.3333333333333333);
  armor_min = (int)((double)armor * 0.6666666666666666);
  std::istream::operator>>(psStack_10,&carrierNum);
  std::__cxx11::string::string((string *)&ifFighterOnly);
  for (local_44 = 0; local_44 < carrierNum; local_44 = local_44 + 1) {
    this = std::operator>>((istream *)psStack_10,(string *)&ifFighterOnly);
    pvVar3 = (void *)std::istream::operator>>(this,&i);
    std::istream::operator>>(pvVar3,&local_40);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[](&carriers_m_abi_cxx11_,(key_type *)&ifFighterOnly);
    bit = *pmVar4;
    pvVar5 = std::vector<Carrier,_std::allocator<Carrier>_>::operator[](&carriers,(long)bit);
    j = pvVar5->gridNum;
    pvVar5 = std::vector<Carrier,_std::allocator<Carrier>_>::operator[](&carriers,(long)bit);
    std::vector<Carrier,_std::allocator<Carrier>_>::push_back(&theCarrier,pvVar5);
    local_60 = 1 << (4U - (char)j & 0x1f);
    availGrid[local_44] = 0;
    tmpGridSize._4_4_ = j;
    while (tmpGridSize._4_4_ = tmpGridSize._4_4_ + -1, -1 < tmpGridSize._4_4_) {
      if ((i & local_60) != 0) {
        pvVar5 = std::vector<Carrier,_std::allocator<Carrier>_>::operator[](&carriers,(long)bit);
        _cpos = local_44;
        _gpos = tmpGridSize._4_4_;
        local_70 = pvVar5->gridSize + tmpGridSize._4_4_;
        _gS = *local_70;
        dVar1 = *(double *)(&DAT_00122190 + (ulong)(tmpGridSize._4_4_ == 0) * 8);
        pvVar5 = std::vector<Carrier,_std::allocator<Carrier>_>::operator[](&carriers,(long)bit);
        _atk = pvVar5->atk;
        bVar2 = checkIfFighterOnly(*local_70,local_14,local_40);
        Grid::Grid((Grid *)&i_1,_cpos,_gpos,_gS,(int)((double)_gS * dVar1),_atk,(uint)bVar2);
        std::vector<Grid,_std::allocator<Grid>_>::push_back(&gridVec,(value_type *)&i_1);
        pvVar6 = std::vector<Grid,_std::allocator<Grid>_>::back(&gridVec);
        if (pvVar6->isFighterOnly == 0) {
          availGrid[local_44] = availGrid[local_44] + 1;
          attackerAbleGridNum = attackerAbleGridNum + 1;
        }
      }
      local_60 = local_60 << 1;
    }
  }
  std::istream::operator>>(psStack_10,&tmpPlaneID);
  for (tmpNum = 0; tmpNum < tmpPlaneID; tmpNum = tmpNum + 1) {
    std::operator>>((istream *)psStack_10,(string *)&ifFighterOnly);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[](&planes_m_abi_cxx11_,(key_type *)&ifFighterOnly);
    i_2 = *pmVar4;
    std::istream::operator>>(psStack_10,&local_98);
    for (local_9c = 0; local_9c < local_98; local_9c = local_9c + 1) {
      __x = std::vector<Plane,_std::allocator<Plane>_>::operator[](&planes,(long)i_2);
      std::vector<Plane,_std::allocator<Plane>_>::push_back(&planeVec,__x);
    }
  }
  std::__cxx11::string::~string((string *)&ifFighterOnly);
  return;
}

Assistant:

void cal_dataReady(stringstream &st){//��query������Ҫ����
    int leastAttackerSz;
    st>>tarAirSupremacy>>op_coef>>accu_coef>>leastAttackerSz>>armor>>nearing_coef;

    armor_max=armor*(4.0/3);
    armor_min=armor*(2.0/3);
    //read carrier
    st>>carrierNum;
    string tmpName;
    int tmpAvailBit,ifFighterOnly;
    for(int i=0;i<carrierNum;i++){
        st>>tmpName>>tmpAvailBit>>ifFighterOnly;
        int tmpCarrierID=carriers_m[tmpName];
        int tmpCarrierGridNum=carriers[tmpCarrierID].gridNum;
        theCarrier.push_back(carriers[tmpCarrierID]);
        int bit=1<<(4-tmpCarrierGridNum);
        //insert grid
        availGrid[i]=0;

        for(int j=tmpCarrierGridNum-1;j>=0;j--){
            if(tmpAvailBit&bit){//bit arithmatic judge if the grid available
                int &tmpGridSize=carriers[tmpCarrierID].gridSize[j];
                gridVec.push_back(Grid(i,j,tmpGridSize, tmpGridSize*(j==0?FIRST_SLOT_BUFF:1),carriers[tmpCarrierID].atk,checkIfFighterOnly(tmpGridSize,leastAttackerSz,ifFighterOnly)));
                if(!gridVec.back().isFighterOnly){
                    availGrid[i]++;
                    attackerAbleGridNum++;
                }
            }
            bit<<=1;
        }
    }

    //read plane
    int planeTypeNum;
    st>>planeTypeNum;
    for(int i=0;i<planeTypeNum;i++){
        st>>tmpName;
        int tmpPlaneID=planes_m[tmpName];
        int tmpNum;
        st>>tmpNum;
        for(int i=0;i<tmpNum;i++)
            planeVec.push_back(planes[tmpPlaneID]);
    }
}